

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ExtensionPackTestCase::init
          (ExtensionPackTestCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined7 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ANDROID_extension_pack_es31a");
  if (bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Test requires GL_ANDROID_extension_pack_es31a extension",&local_39
            );
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExtensionPackTestCase::init (void)
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ANDROID_extension_pack_es31a"))
		throw tcu::NotSupportedError("Test requires GL_ANDROID_extension_pack_es31a extension");
}